

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O3

int tnt_object_reset(tnt_stream *s)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = s->data;
  lVar2 = *(long *)((long)pvVar1 + 0x30);
  s->reqid = 0;
  s->wrcnt = 0;
  *(undefined8 *)((long)pvVar1 + 8) = 0;
  *(undefined8 *)((long)pvVar1 + 0x18) = 0;
  *(undefined1 *)(lVar2 + 8) = 0;
  *(undefined4 *)(lVar2 + 0xc) = 0;
  return 0;
}

Assistant:

int tnt_object_reset(struct tnt_stream *s)
{
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);

	s->reqid = 0;
	s->wrcnt = 0;
	sb->size = 0;
	sb->rdoff = 0;
	sbo->stack_size = 0;
	sbo->type = TNT_SBO_SIMPLE;

	return 0;
}